

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O1

leb_Node leb_BoundingNode_Quad(leb_Heap *leb,float x,float y)

{
  uint32_t uVar1;
  uint32_t uVar2;
  leb_Node lVar3;
  leb_Node lVar4;
  leb_Node lVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float local_5c;
  
  lVar3.id = 0;
  lVar3.depth = 0;
  lVar4.id = 0;
  lVar4.depth = 0;
  uVar7 = 0;
  if ((((y <= 1.0) && (x <= 1.0)) && (0.0 <= x)) && (lVar3 = lVar4, 0.0 <= y)) {
    uVar7 = 0x100000000;
    fVar9 = x + y;
    lVar3.id = (1.0 < fVar9) + 2;
    lVar3.depth = 0;
    lVar4 = (leb_Node)((ulong)lVar3 | 0x100000000);
    uVar1 = leb__HeapRead(leb,lVar4);
    if (uVar1 != 1) {
      fVar8 = (float)(~-(uint)(1.0 < fVar9) & (uint)x | (uint)(1.0 - x) & -(uint)(1.0 < fVar9));
      if (1.0 < fVar9) {
        y = 1.0 - y;
      }
      uVar7 = 1;
      uVar6 = 0x100000000;
      do {
        uVar2 = (uint32_t)uVar7;
        uVar1 = lVar3.id;
        lVar5 = lVar3;
        if (leb->maxDepth == uVar2) break;
        if (y <= fVar8) {
          if (uVar1 != uVar2) {
            lVar4 = (leb_Node)((ulong)(uVar1 * 2) | uVar6 + 0x100000000 | 1);
          }
          local_5c = (1.0 - fVar8) - y;
        }
        else {
          if (uVar1 != uVar2) {
            lVar4 = (leb_Node)((ulong)(uVar1 * 2) | uVar6 + 0x100000000);
          }
          local_5c = y - fVar8;
          fVar8 = 1.0 - fVar8;
        }
        uVar7 = (ulong)lVar4 >> 0x20;
        fVar8 = fVar8 - y;
        uVar6 = (ulong)lVar4 & 0xffffffff00000000;
        lVar3 = (leb_Node)((ulong)lVar4 & 0xffffffff);
        uVar1 = leb__HeapRead(leb,lVar4);
        lVar5 = lVar4;
        y = local_5c;
      } while (uVar1 != 1);
      uVar7 = uVar7 << 0x20;
      lVar3 = (leb_Node)((ulong)lVar5 & 0xffffffff);
    }
  }
  return (leb_Node)((ulong)lVar3 | uVar7);
}

Assistant:

LEBDEF leb_Node leb_BoundingNode_Quad(const leb_Heap *leb, float x, float y)
{
    leb_Node node = {0u, 0};

    if (x >= 0.0f && y >= 0.0f && x <= 1.0f && y <= 1.0f) {
        if (x + y <= 1.0f) {
            node = {2u, 1};
        } else {
            node = {3u, 1};
            x = 1 - x;
            y = 1 - y;
        }

        while (!leb_IsLeafNode(leb, node) && !leb_IsCeilNode(leb, node)) {
            float s = x, t = y;

            if (s < t) {
                node = leb__LeftChildNode(node);
                x = (1.0f - s - t);
                y = (t - s);
            } else {
                node = leb__RightChildNode(node);
                x = (s - t);
                y = (1.0f - s - t);
            }
        }
    }

    return node;
}